

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O0

QMimeData * __thiscall QUrlModel::mimeData(QUrlModel *this,QModelIndexList *indexes)

{
  bool bVar1;
  int iVar2;
  QModelIndex *this_00;
  QMimeData *this_01;
  long in_FS_OFFSET;
  QMimeData *data;
  QModelIndex *index;
  QModelIndexList *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QUrl> list;
  rvalue_ref in_stack_ffffffffffffff58;
  QList<QModelIndex> *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff70;
  QModelIndex *in_stack_ffffffffffffff78;
  QUrl local_60;
  QModelIndex *local_58;
  const_iterator local_50;
  const_iterator local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QUrl>::QList((QList<QUrl> *)0x784354);
  local_48.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = QList<QModelIndex>::begin(in_stack_ffffffffffffff60);
  local_50.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_50 = QList<QModelIndex>::end(in_stack_ffffffffffffff60);
  while( true ) {
    local_58 = local_50.i;
    bVar1 = QList<QModelIndex>::const_iterator::operator!=(&local_48,local_50);
    if (!bVar1) break;
    this_00 = QList<QModelIndex>::const_iterator::operator*(&local_48);
    iVar2 = QModelIndex::column(this_00);
    if (iVar2 == 0) {
      QModelIndex::data(in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
      ::QVariant::toUrl();
      QList<QUrl>::append((QList<QUrl> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      QUrl::~QUrl(&local_60);
      ::QVariant::~QVariant(&local_28);
    }
    QList<QModelIndex>::const_iterator::operator++(&local_48);
  }
  this_01 = (QMimeData *)operator_new(0x10);
  QMimeData::QMimeData(this_01);
  QMimeData::setUrls((QList_conflict2 *)this_01);
  QList<QUrl>::~QList((QList<QUrl> *)0x78449b);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_01;
  }
  __stack_chk_fail();
}

Assistant:

QMimeData *QUrlModel::mimeData(const QModelIndexList &indexes) const
{
    QList<QUrl> list;
    for (const auto &index : indexes) {
        if (index.column() == 0)
           list.append(index.data(UrlRole).toUrl());
    }
    QMimeData *data = new QMimeData();
    data->setUrls(list);
    return data;
}